

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.h
# Opt level: O0

Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>
kj::rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>(void)

{
  ThirdPartyExchangeValue *this;
  Refcounted *in_RDI;
  Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue> RVar1;
  
  this = (ThirdPartyExchangeValue *)operator_new(0x70);
  *(undefined8 *)((long)&(this->value).field_1 + 0x48) = 0;
  *(undefined8 *)((long)&(this->value).field_1 + 0x50) = 0;
  *(undefined8 *)((long)&(this->value).field_1 + 0x38) = 0;
  *(undefined8 *)((long)&(this->value).field_1 + 0x40) = 0;
  *(undefined8 *)((long)&(this->value).field_1 + 0x28) = 0;
  *(undefined8 *)((long)&(this->value).field_1 + 0x30) = 0;
  *(undefined8 *)((long)&(this->value).field_1 + 0x18) = 0;
  *(undefined8 *)((long)&(this->value).field_1 + 0x20) = 0;
  *(undefined8 *)((long)&(this->value).field_1 + 8) = 0;
  *(undefined8 *)((long)&(this->value).field_1 + 0x10) = 0;
  *(undefined8 *)&this->value = 0;
  *(undefined8 *)&(this->value).field_1 = 0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  *(undefined8 *)&(this->super_Refcounted).refcount = 0;
  ::capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue::ThirdPartyExchangeValue
            (this);
  RVar1 = Refcounted::
          addRcRefInternal<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>
                    (in_RDI,this);
  RVar1.own.disposer = &in_RDI->super_Disposer;
  return (Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>)RVar1.own;
}

Assistant:

inline Rc<T> rc(Params&&... params) {
  // Allocate a new refcounted instance of T, passing `params` to its constructor.
  // Returns smart pointer that can be used to manage references.

  return Refcounted::addRcRefInternal(new T(kj::fwd<Params>(params)...));
}